

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cpp
# Opt level: O0

void __thiscall
zmq::pair_t::xattach_pipe(pair_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  long in_RSI;
  long in_RDI;
  
  if (in_RSI == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_ != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pair.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort((char *)0x2fd4e1);
  }
  if (*(long *)(in_RDI + 0x6e8) == 0) {
    *(long *)(in_RDI + 0x6e8) = in_RSI;
  }
  else {
    pipe_t::terminate((pipe_t *)this,pipe_._7_1_);
  }
  return;
}

Assistant:

void zmq::pair_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_ != NULL);

    //  ZMQ_PAIR socket can only be connected to a single peer.
    //  The socket rejects any further connection requests.
    if (_pipe == NULL)
        _pipe = pipe_;
    else
        pipe_->terminate (false);
}